

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

void __thiscall QFile::setFileName(QFile *this,QString *name)

{
  bool bVar1;
  QString *in_RDI;
  QFilePrivate *d;
  pointer in_stack_ffffffffffffffd8;
  
  d_func((QFile *)0x2a2c71);
  bVar1 = QIODevice::isOpen((QIODevice *)in_RDI);
  if (bVar1) {
    file_already_open(this,(char *)name);
    (**(_func_int **)&(in_RDI->d).d[7].super_QArrayData)();
  }
  std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::reset
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)in_RDI,
             in_stack_ffffffffffffffd8);
  QString::operator=(in_RDI,(QString *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
QFile::setFileName(const QString &name)
{
    Q_D(QFile);
    if (isOpen()) {
        file_already_open(*this, "setFileName");
        close();
    }
    d->fileEngine.reset(); //get a new file engine later
    d->fileName = name;
}